

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

bool __thiscall libcellml::Component::removeVariable(Component *this,VariablePtr *variable)

{
  EntityImpl *pEVar1;
  shared_ptr<libcellml::Variable> *psVar2;
  const_iterator __position;
  VariableImpl *this_00;
  
  __position = ComponentImpl::findVariable
                         ((ComponentImpl *)
                          (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                          super_Entity.mPimpl,variable);
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  psVar2 = (shared_ptr<libcellml::Variable> *)pEVar1[6].mId.field_2._M_allocated_capacity;
  if (__position._M_current != psVar2) {
    std::
    vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
    ::erase((vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
             *)&pEVar1[6].mId._M_string_length,__position);
    this_00 = Variable::pFunc((variable->
                              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
  }
  return __position._M_current != psVar2;
}

Assistant:

bool Component::removeVariable(const VariablePtr &variable)
{
    auto result = pFunc()->findVariable(variable);
    if (result != pFunc()->mVariables.end()) {
        pFunc()->mVariables.erase(result);
        variable->pFunc()->removeParent();
        return true;
    }

    return false;
}